

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPMT_HA_Array_Unmarshal(TPMT_HA *target,BYTE **buffer,INT32 *size,BOOL flag,INT32 count)

{
  TPM_RC TVar1;
  ulong uVar2;
  
  if (0 < count) {
    uVar2 = (ulong)(uint)count;
    do {
      TVar1 = TPMT_HA_Unmarshal(target,buffer,size,flag);
      if (TVar1 != 0) {
        return TVar1;
      }
      target = target + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return 0;
}

Assistant:

TPM_RC
TPMT_HA_Array_Unmarshal(TPMT_HA *target, BYTE **buffer, INT32 *size, BOOL flag, INT32 count)
{
    TPM_RC    result;
    INT32 i;
    for(i = 0; i < count; i++) {
        result = TPMT_HA_Unmarshal(&target[i], buffer, size, flag);
        if(result != TPM_RC_SUCCESS)
            return result;
    }
    return TPM_RC_SUCCESS;
}